

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall bidirectional::Search::makeHeap(Search *this)

{
  iterator iVar1;
  iterator iVar2;
  vector<labelling::Label,_std::allocator<labelling::Label>_> *in_RDI;
  __normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
  in_stack_ffffffffffffffe0;
  
  if (*(int *)&(in_RDI->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>).
               _M_impl.super__Vector_impl_data._M_start == 0) {
    std::
    unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
    ::operator->((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                  *)0x2ced47);
    iVar1 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::begin(in_RDI);
    std::
    unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
    ::operator->((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                  *)0x2ced64);
    iVar2 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::end(in_RDI);
    std::
    make_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,std::greater<void>>
              (iVar1._M_current,iVar2._M_current);
  }
  else {
    std::
    unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
    ::operator->((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                  *)0x2ced92);
    iVar1 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::begin(in_RDI);
    std::
    unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
    ::operator->((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                  *)0x2cedaf);
    std::vector<labelling::Label,_std::allocator<labelling::Label>_>::end(in_RDI);
    std::
    make_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>>
              (in_stack_ffffffffffffffe0,
               (__normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                )iVar1._M_current);
  }
  return;
}

Assistant:

void Search::makeHeap() {
  if (direction == FWD) {
    // Min-heap
    std::make_heap(
        unprocessed_labels->begin(),
        unprocessed_labels->end(),
        std::greater<>{});
  } else {
    // Max-heap
    std::make_heap(unprocessed_labels->begin(), unprocessed_labels->end());
  }
}